

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listReporters(void)

{
  size_t this;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
  *this_00;
  unsigned_long *puVar5;
  Column *pCVar6;
  element_type *peVar7;
  Column *pCVar8;
  size_type sVar9;
  string local_128;
  Column local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Column local_a8;
  Columns local_78;
  reference local_60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>
  *factoryKvp_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  FactoryMap *__range1_1;
  reference local_38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>
  *factoryKvp;
  const_iterator __end1;
  const_iterator __begin1;
  FactoryMap *__range1;
  size_t maxNameLen;
  FactoryMap *factories;
  
  poVar3 = cout();
  std::operator<<(poVar3,"Available reporters:\n");
  pIVar4 = getRegistryHub();
  iVar2 = (*pIVar4->_vptr_IRegistryHub[2])();
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
             *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))();
  __range1 = (FactoryMap *)0x0;
  maxNameLen = (size_t)this_00;
  __end1 = clara::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
           ::begin(this_00);
  factoryKvp = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>
                *)clara::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
                  ::end(this_00);
  while( true ) {
    bVar1 = clara::std::operator==(&__end1,(_Self *)&factoryKvp);
    this = maxNameLen;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_38 = clara::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
               ::operator*(&__end1);
    __range1_1 = (FactoryMap *)
                 clara::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                           (&local_38->first);
    puVar5 = clara::std::max<unsigned_long>((unsigned_long *)&__range1,(unsigned_long *)&__range1_1)
    ;
    __range1 = (FactoryMap *)*puVar5;
    clara::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = clara::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
                      *)maxNameLen);
  factoryKvp_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>
                  *)clara::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
                    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
                           *)this);
  while( true ) {
    bVar1 = clara::std::operator==(&__end1_1,(_Self *)&factoryKvp_1);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_60 = clara::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
               ::operator*(&__end1_1);
    poVar3 = cout();
    std::operator+(&local_c8,&local_60->first,":");
    clara::TextFlow::Column::Column(&local_a8,&local_c8);
    pCVar6 = clara::TextFlow::Column::indent(&local_a8,2);
    pCVar6 = clara::TextFlow::Column::width(pCVar6,(size_t)&(__range1->_M_t)._M_impl.field_0x5);
    peVar7 = clara::std::
             __shared_ptr_access<Catch::IReporterFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::IReporterFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_60->second);
    (*peVar7->_vptr_IReporterFactory[3])(&local_128);
    clara::TextFlow::Column::Column(&local_108,&local_128);
    pCVar8 = clara::TextFlow::Column::initialIndent(&local_108,0);
    pCVar8 = clara::TextFlow::Column::indent(pCVar8,2);
    pCVar8 = clara::TextFlow::Column::width(pCVar8,0x48 - (long)__range1);
    clara::TextFlow::Column::operator+(&local_78,pCVar6,pCVar8);
    poVar3 = clara::TextFlow::operator<<(poVar3,&local_78);
    std::operator<<(poVar3,"\n");
    clara::TextFlow::Columns::~Columns(&local_78);
    clara::TextFlow::Column::~Column(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    clara::TextFlow::Column::~Column(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    clara::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
    ::operator++(&__end1_1);
  }
  poVar3 = cout();
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sVar9 = clara::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
                  *)maxNameLen);
  return sVar9;
}

Assistant:

std::size_t listReporters() {
        Catch::cout() << "Available reporters:\n";
        IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();
        std::size_t maxNameLen = 0;
        for( auto const& factoryKvp : factories )
            maxNameLen = (std::max)( maxNameLen, factoryKvp.first.size() );

        for( auto const& factoryKvp : factories ) {
            Catch::cout()
                    << Column( factoryKvp.first + ":" )
                            .indent(2)
                            .width( 5+maxNameLen )
                    +  Column( factoryKvp.second->getDescription() )
                            .initialIndent(0)
                            .indent(2)
                            .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen-8 )
                    << "\n";
        }
        Catch::cout() << std::endl;
        return factories.size();
    }